

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void CVmObjBigNum::compute_sqrt_into(char *dst,char *src)

{
  char *pcVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 *puVar7;
  long *plVar8;
  char *in_RSI;
  char *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  char *in_stack_00000050;
  size_t idx;
  char *tmp;
  err_frame_t err_cur__;
  size_t dst_prec;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  uint *ext;
  char **src_00;
  uint *dst_00;
  unsigned_long in_stack_fffffffffffffe98;
  undefined8 uVar9;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  ulong local_140;
  uint local_130 [2];
  undefined8 local_128;
  void *local_120;
  char *local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  char *local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  char *local_18;
  
  local_18 = in_RSI;
  sVar5 = get_prec((char *)0x2b9ba5);
  iVar3 = get_neg(local_18);
  if (iVar3 != 0) {
    err_throw(0);
  }
  sVar6 = get_prec((char *)0x2b9bd6);
  iVar3 = (int)((ulong)local_40 >> 0x20);
  ext = &local_24;
  src_00 = &local_48;
  dst_00 = &local_28;
  alloc_temp_regs(sVar6 + 3,4,&local_30,&local_1c,local_38,&local_20);
  puVar7 = (undefined8 *)_ZTW11G_err_frame();
  local_128 = *puVar7;
  plVar8 = (long *)_ZTW11G_err_frame();
  *plVar8 = (long)local_130;
  local_130[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffee8);
  if (local_130[0] == 0) {
    copy_val((char *)dst_00,(char *)src_00,(int)((ulong)ext >> 0x20));
    uVar4 = get_exp((char *)0x2b9c98);
    if ((uVar4 & 1) == 0) {
      in_stack_fffffffffffffeb0 = local_30;
      get_exp((char *)0x2b9d03);
      set_exp((char *)ext,iVar3);
      mul_by_long((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                  in_stack_fffffffffffffe98);
    }
    else {
      get_exp((char *)0x2b9cba);
      set_exp((char *)ext,iVar3);
      div_by_long(in_stack_fffffffffffffeb0,
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (unsigned_long *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    while (iVar3 = is_zero(local_30), iVar3 == 0) {
      compute_quotient_into(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038)
      ;
      compute_sum_into((char *)dst_00,(char *)src_00,(char *)ext);
      div_by_long(in_stack_fffffffffffffeb0,
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (unsigned_long *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      in_stack_fffffffffffffeac = get_neg(local_30);
      iVar3 = get_neg(local_48);
      if (in_stack_fffffffffffffeac == iVar3) {
        in_stack_fffffffffffffea8 = get_exp((char *)0x2b9dcf);
        iVar3 = get_exp((char *)0x2b9de0);
        if (in_stack_fffffffffffffea8 == iVar3) {
          for (local_140 = 0; local_140 < sVar5 + 1; local_140 = local_140 + 1) {
            in_stack_fffffffffffffea4 = get_dig(local_30,local_140);
            uVar4 = get_dig(local_48,local_140);
            if (in_stack_fffffffffffffea4 != uVar4) break;
          }
          if (sVar5 + 1 <= local_140) break;
        }
      }
      pcVar1 = local_48;
      local_48 = local_30;
      local_30 = pcVar1;
    }
    copy_val((char *)dst_00,(char *)src_00,(int)((ulong)ext >> 0x20));
  }
  if ((local_130[0] & 0x8000) == 0) {
    local_130[0] = local_130[0] | 0x8000;
    release_temp_regs(4,(ulong)local_1c,(ulong)local_20,(ulong)local_24,(ulong)local_28);
  }
  uVar9 = local_128;
  puVar7 = (undefined8 *)_ZTW11G_err_frame();
  *puVar7 = uVar9;
  if ((local_130[0] & 0x4001) != 0) {
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar7 & 2) != 0) {
      plVar8 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar8 + 0x10));
    }
    pvVar2 = local_120;
    plVar8 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar8 + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_130[0] & 2) != 0) {
    free(local_120);
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_sqrt_into(char *dst, const char *src)
{
    uint hdl1, hdl2, hdl3, hdl4;
    char *ext1, *ext2, *ext3, *ext4;
    size_t dst_prec = get_prec(dst);

    /* if the value is negative, it's an error */
    if (get_neg(src))
        err_throw(VMERR_OUT_OF_RANGE);
    
    /* allocate our scratchpad registers */
    alloc_temp_regs(get_prec(dst) + 3, 4,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4);

    /* catch errors so we can free our registers */
    err_try
    {
        /* 
         *   Compute our initial guess.  Since our number is represented as
         *   
         *   (n * 10^exp),
         *   
         *   the square root can be written as
         *   
         *   sqrt(n) * sqrt(10^exp) = sqrt(n) * 10^(exp/2)
         *   
         *   Approximate sqrt(n) as simply n for our initial guess.  This
         *   will get us to the right order of magnitude plus or minus
         *   one, so we should converge pretty quickly.
         *   
         *   If we have an odd exponent, round up and divide the mantissa
         *   by 2 - this will be something like 0.456e7, which can be
         *   written as 4.56e6, whose square root is about 2e3, or .2e4.
         *   
         *   If we have an even exponent, multiply the mantissa by 2.
         *   This will be something like .456e8, whose square root is
         *   about .67e4.
         *   
         *   Note that it's well worth the trouble to make a good initial
         *   approximation, even with the multiply/divide, because these
         *   operations with longs are much more efficient than the full
         *   BigNum divide we'll have to do on each iteration.  
         */
        copy_val(ext1, src, TRUE);
        if ((get_exp(ext1) & 1) != 0)
        {
            /* odd exponent - round up and divide the mantissa by two */
            set_exp(ext1, (get_exp(ext1) + 1)/2);
            div_by_long(ext1, 2);
        }
        else
        {
            /* even exponent - multiply mantissa by two */
            set_exp(ext1, get_exp(ext1)/2);
            mul_by_long(ext1, 2);
        }

        /* iterate until we get close enough to the solution */
        for (;;)
        {
            char *tmp;
            size_t idx;
            
            /* 
             *   Calculate the next iteration's approximation, noting that r1
             *   contains the current iteration's value p:
             *   
             *   p' = p/2 + src/2p = (p + src/p)/2
             *   
             *   Note that if p == 0, we can't compute src/p, so we can't
             *   iterate any further.  
             */
            if (is_zero(ext1))
                break;

            /* calculate src/p into r3 */
            compute_quotient_into(ext3, 0, src, ext1);

            /* compute p + src/p into r4 */
            compute_sum_into(ext4, ext1, ext3);

            /* compute (p + src/p)/2 into r4 */
            div_by_long(ext4, 2);

            /* 
             *   check for convergence - if the new value equals the old
             *   value to the precision requested for the result, we are
             *   at the limit of our ability to distinguish differences in
             *   future terms, so we can stop 
             */
            if (get_neg(ext1) == get_neg(ext4)
                && get_exp(ext1) == get_exp(ext4))
            {
                /* 
                 *   they're the same sign and magnitude - compare the
                 *   digits to see where they first differ 
                 */
                for (idx = 0 ; idx < dst_prec + 1 ; ++idx)
                {
                    /* if they differ here, stop scanning */
                    if (get_dig(ext1, idx) != get_dig(ext4, idx))
                        break;
                }

                /* 
                 *   if we didn't find any difference up to the output
                 *   precision plus one digit (for rounding), further
                 *   iteration will be of no value 
                 */
                if (idx >= dst_prec + 1)
                    break;
            }

            /* swap the new value into r1 for the next round */
            tmp = ext1;
            ext1 = ext4;
            ext4 = tmp;
        }

        /* 
         *   copy the last iteration's value into the destination,
         *   rounding as needed 
         */
        copy_val(dst, ext1, TRUE);
    }